

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinarySearchTree.cpp
# Opt level: O3

bool __thiscall BinarySearchTree::insert(BinarySearchTree *this,Node *node,Node *newNode)

{
  int iVar1;
  Node *pNVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  bool bVar6;
  
  if (this->root == (Node *)0x0) {
    pNVar2 = (Node *)operator_new(0x18);
    this->root = pNVar2;
    pNVar2->value = newNode->value;
    pNVar2->leftChild = (Node *)0x0;
    pNVar2->rightChild = (Node *)0x0;
    bVar4 = 1;
    bVar6 = false;
  }
  else {
    iVar1 = newNode->value;
    iVar5 = node->value;
    bVar6 = iVar5 != iVar1;
    if (bVar6) {
      bVar3 = false;
      do {
        if (iVar5 <= iVar1) {
          pNVar2 = node->rightChild;
          if (node->rightChild != (Node *)0x0) goto LAB_001059fc;
          node->rightChild = newNode;
          newNode->leftChild = (Node *)0x0;
          newNode->rightChild = (Node *)0x0;
LAB_00105a4c:
          bVar4 = 1;
          bVar6 = bVar3;
          goto LAB_00105a50;
        }
        pNVar2 = node->leftChild;
        if (node->leftChild == (Node *)0x0) {
          node->leftChild = newNode;
          newNode->leftChild = (Node *)0x0;
          node->leftChild->rightChild = (Node *)0x0;
          goto LAB_00105a4c;
        }
LAB_001059fc:
        node = pNVar2;
        iVar5 = node->value;
        bVar3 = true;
      } while (iVar5 != iVar1);
    }
    bVar4 = 0;
  }
LAB_00105a50:
  return (bool)((bVar6 ^ 1U) & bVar4);
}

Assistant:

bool BinarySearchTree::insert(Node *node, Node *newNode) {
    if (root == nullptr) {
        root = new Node;
        root->value = newNode->value;
        root->leftChild = nullptr;
        root->rightChild = nullptr;
        //  std::cout << "Root Node is Added" << std::endl;
        return true;
    }
    if (node->value == newNode->value) {
        //  std::cout << "Element already in the tree" << std::endl;
        return false;
    }
    if (node->value > newNode->value) {
        if (node->leftChild != nullptr) {
            insert(node->leftChild, newNode);
        } else {
            node->leftChild = newNode;
            (node->leftChild)->leftChild = nullptr;
            (node->leftChild)->rightChild = nullptr;
            //  std::cout << "Node Added To Left" << std::endl;
            return true;
        }
    } else {
        if (node->rightChild != nullptr) {
            insert(node->rightChild, newNode);
        } else {
            node->rightChild = newNode;
            (node->rightChild)->leftChild = nullptr;
            (node->rightChild)->rightChild = nullptr;
            //  std::cout << "Node Added To Right" << std::endl;
            return true;
        }
    }
    return false;
}